

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_swp.cpp
# Opt level: O1

int32_t anon_unknown.dwarf_152271::swapFormatVersion3
                  (UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *pErrorCode
                  )

{
  uint16_t uVar1;
  uint16_t uVar2;
  int32_t iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  int32_t iVar13;
  int32_t iVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  ulong uVar17;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return 0;
  }
  if ((-2 < length && (inData != (void *)0x0 && ds != (UDataSwapper *)0x0)) &&
     (outData != (void *)0x0 || length < 1)) {
    if (length < 0) {
      iVar3 = udata_readInt32_63(ds,*inData);
    }
    else if ((length < 0xa8) || (iVar3 = udata_readInt32_63(ds,*inData), length < iVar3)) {
      udata_printError_63(ds,
                          "ucol_swap(formatVersion=3): too few bytes (%d after header) for collation data\n"
                          ,(ulong)(uint)length);
      *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      return 0;
    }
    uVar4 = (*ds->readUInt32)(*(uint32_t *)((long)inData + 0x10));
    if ((uVar4 == 0x20030618) && (*(char *)((long)inData + 0x50) == '\x03')) {
      if ((*(char *)((long)inData + 0x41) == ds->inIsBigEndian) &&
         (*(uint8_t *)((long)inData + 0x42) == ds->inCharset)) {
        if (-1 < length) {
          if (inData != outData) {
            memcpy(outData,inData,(long)iVar3);
          }
          uVar4 = (*ds->readUInt32)(*(uint32_t *)((long)inData + 4));
          uVar5 = (*ds->readUInt32)(*(uint32_t *)((long)inData + 8));
          uVar6 = (*ds->readUInt32)(*(uint32_t *)((long)inData + 0xc));
          uVar7 = (*ds->readUInt32)(*(uint32_t *)((long)inData + 0x14));
          uVar8 = (*ds->readUInt32)(*(uint32_t *)((long)inData + 0x18));
          uVar9 = (*ds->readUInt32)(*(uint32_t *)((long)inData + 0x1c));
          uVar10 = (*ds->readUInt32)(*(uint32_t *)((long)inData + 0x20));
          uVar11 = (*ds->readUInt32)(*(uint32_t *)((long)inData + 0x24));
          uVar12 = (*ds->readUInt32)(*(uint32_t *)((long)inData + 0x28));
          (*ds->readUInt32)(*(uint32_t *)((long)inData + 0x2c));
          iVar13 = udata_readInt32_63(ds,*(int32_t *)((long)inData + 0x30));
          iVar14 = udata_readInt32_63(ds,*(int32_t *)((long)inData + 0x3c));
          uVar15 = (*ds->readUInt32)(*(uint32_t *)((long)inData + 0x54));
          uVar16 = (*ds->readUInt32)(*(uint32_t *)((long)inData + 0x58));
          (*ds->swapArray32)(ds,inData,0x40,outData,pErrorCode);
          (*ds->swapArray32)(ds,(void *)((long)inData + 0x54),8,(void *)((long)outData + 0x54),
                             pErrorCode);
          *(UBool *)((long)outData + 0x41) = ds->outIsBigEndian;
          *(uint8_t *)((long)outData + 0x42) = ds->outCharset;
          if (uVar4 != 0) {
            (*ds->swapArray32)(ds,(void *)((long)inData + (ulong)uVar4),uVar8 - uVar4,
                               (void *)((ulong)uVar4 + (long)outData),pErrorCode);
          }
          if (uVar8 != 0 && uVar7 != 0) {
            uVar4 = uVar9;
            if (uVar9 == 0) {
              uVar4 = uVar7;
            }
            (*ds->swapArray32)(ds,(void *)((long)inData + (ulong)uVar8),uVar4 - uVar8,
                               (void *)((ulong)uVar8 + (long)outData),pErrorCode);
          }
          if (uVar11 != 0) {
            (*ds->swapArray16)(ds,(void *)((long)inData + (ulong)uVar9),uVar11 * 2,
                               (void *)((ulong)uVar9 + (long)outData),pErrorCode);
            (*ds->swapArray32)(ds,(void *)((long)inData + (ulong)uVar10),uVar11 << 2,
                               (void *)((ulong)uVar10 + (long)outData),pErrorCode);
          }
          if (uVar7 != 0) {
            utrie_swap_63(ds,(void *)((long)inData + (ulong)uVar7),uVar12 - uVar7,
                          (void *)((ulong)uVar7 + (long)outData),pErrorCode);
          }
          if (iVar13 != 0) {
            (*ds->swapArray32)(ds,(void *)((long)inData + (ulong)uVar12),iVar13 << 2,
                               (void *)((ulong)uVar12 + (long)outData),pErrorCode);
          }
          if (uVar5 != 0) {
            (*ds->swapArray32)(ds,(void *)((long)inData + (ulong)uVar5),uVar6 - uVar5,
                               (void *)((ulong)uVar5 + (long)outData),pErrorCode);
          }
          if (iVar14 != 0) {
            (*ds->swapArray16)(ds,(void *)((long)inData + (ulong)uVar6),
                               iVar14 * (uint)*(byte *)((long)inData + 0x43) * 2,
                               (void *)((ulong)uVar6 + (long)outData),pErrorCode);
          }
          if (uVar15 != 0) {
            uVar17 = (ulong)uVar15;
            uVar1 = (*ds->readUInt16)(*(uint16_t *)((long)inData + uVar17));
            uVar2 = (*ds->readUInt16)(*(uint16_t *)((long)inData + uVar17 + 2));
            (*ds->swapArray16)(ds,(void *)((long)inData + uVar17),
                               (uint)uVar2 * 2 + (uint)uVar1 * 4 + 4,
                               (void *)(uVar17 + (long)outData),pErrorCode);
          }
          if (uVar16 != 0) {
            uVar17 = (ulong)uVar16;
            uVar1 = (*ds->readUInt16)(*(uint16_t *)((long)inData + uVar17));
            uVar2 = (*ds->readUInt16)(*(uint16_t *)((long)inData + uVar17 + 2));
            (*ds->swapArray16)(ds,(void *)((long)inData + uVar17),
                               ((uint)uVar2 + (uint)uVar1) * 2 + 4,(void *)((long)outData + uVar17),
                               pErrorCode);
          }
        }
      }
      else {
        iVar3 = 0;
        udata_printError_63(ds,
                            "ucol_swap(formatVersion=3): endianness %d or charset %d does not match the swapper\n"
                            ,(ulong)(uint)(int)*(char *)((long)inData + 0x41),
                            (ulong)*(byte *)((long)inData + 0x42));
        *pErrorCode = U_INVALID_FORMAT_ERROR;
      }
    }
    else {
      iVar3 = 0;
      udata_printError_63(ds,
                          "ucol_swap(formatVersion=3): magic 0x%08x or format version %02x.%02x is not a collation binary\n"
                          ,(ulong)uVar4,(ulong)*(byte *)((long)inData + 0x50),
                          (ulong)*(byte *)((long)inData + 0x51));
      *pErrorCode = U_UNSUPPORTED_ERROR;
    }
    return iVar3;
  }
  *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  return 0;
}

Assistant:

int32_t
swapFormatVersion3(const UDataSwapper *ds,
                   const void *inData, int32_t length, void *outData,
                   UErrorCode *pErrorCode) {
    const uint8_t *inBytes;
    uint8_t *outBytes;

    const UCATableHeader *inHeader;
    UCATableHeader *outHeader;
    UCATableHeader header;

    uint32_t count;

    /* argument checking in case we were not called from ucol_swap() */
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==NULL || inData==NULL || length<-1 || (length>0 && outData==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    inBytes=(const uint8_t *)inData;
    outBytes=(uint8_t *)outData;

    inHeader=(const UCATableHeader *)inData;
    outHeader=(UCATableHeader *)outData;

    /*
     * The collation binary must contain at least the UCATableHeader,
     * starting with its size field.
     * sizeof(UCATableHeader)==42*4 in ICU 2.8
     * check the length against the header size before reading the size field
     */
    uprv_memset(&header, 0, sizeof(header));
    if(length<0) {
        header.size=udata_readInt32(ds, inHeader->size);
    } else if((length<(42*4) || length<(header.size=udata_readInt32(ds, inHeader->size)))) {
        udata_printError(ds, "ucol_swap(formatVersion=3): too few bytes (%d after header) for collation data\n",
                         length);
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }

    header.magic=ds->readUInt32(inHeader->magic);
    if(!(
        header.magic==UCOL_HEADER_MAGIC &&
        inHeader->formatVersion[0]==3 /*&&
        inHeader->formatVersion[1]>=0*/
    )) {
        udata_printError(ds, "ucol_swap(formatVersion=3): magic 0x%08x or format version %02x.%02x is not a collation binary\n",
                         header.magic,
                         inHeader->formatVersion[0], inHeader->formatVersion[1]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    if(inHeader->isBigEndian!=ds->inIsBigEndian || inHeader->charSetFamily!=ds->inCharset) {
        udata_printError(ds, "ucol_swap(formatVersion=3): endianness %d or charset %d does not match the swapper\n",
                         inHeader->isBigEndian, inHeader->charSetFamily);
        *pErrorCode=U_INVALID_FORMAT_ERROR;
        return 0;
    }

    if(length>=0) {
        /* copy everything, takes care of data that needs no swapping */
        if(inBytes!=outBytes) {
            uprv_memcpy(outBytes, inBytes, header.size);
        }

        /* swap the necessary pieces in the order of their occurrence in the data */

        /* read more of the UCATableHeader (the size field was read above) */
        header.options=                 ds->readUInt32(inHeader->options);
        header.UCAConsts=               ds->readUInt32(inHeader->UCAConsts);
        header.contractionUCACombos=    ds->readUInt32(inHeader->contractionUCACombos);
        header.mappingPosition=         ds->readUInt32(inHeader->mappingPosition);
        header.expansion=               ds->readUInt32(inHeader->expansion);
        header.contractionIndex=        ds->readUInt32(inHeader->contractionIndex);
        header.contractionCEs=          ds->readUInt32(inHeader->contractionCEs);
        header.contractionSize=         ds->readUInt32(inHeader->contractionSize);
        header.endExpansionCE=          ds->readUInt32(inHeader->endExpansionCE);
        header.expansionCESize=         ds->readUInt32(inHeader->expansionCESize);
        header.endExpansionCECount=     udata_readInt32(ds, inHeader->endExpansionCECount);
        header.contractionUCACombosSize=udata_readInt32(ds, inHeader->contractionUCACombosSize);
        header.scriptToLeadByte=        ds->readUInt32(inHeader->scriptToLeadByte);
        header.leadByteToScript=        ds->readUInt32(inHeader->leadByteToScript);
        
        /* swap the 32-bit integers in the header */
        ds->swapArray32(ds, inHeader, (int32_t)((const char *)&inHeader->jamoSpecial-(const char *)inHeader),
                           outHeader, pErrorCode);
        ds->swapArray32(ds, &(inHeader->scriptToLeadByte), sizeof(header.scriptToLeadByte) + sizeof(header.leadByteToScript),
                           &(outHeader->scriptToLeadByte), pErrorCode);
        /* set the output platform properties */
        outHeader->isBigEndian=ds->outIsBigEndian;
        outHeader->charSetFamily=ds->outCharset;

        /* swap the options */
        if(header.options!=0) {
            ds->swapArray32(ds, inBytes+header.options, header.expansion-header.options,
                               outBytes+header.options, pErrorCode);
        }

        /* swap the expansions */
        if(header.mappingPosition!=0 && header.expansion!=0) {
            if(header.contractionIndex!=0) {
                /* expansions bounded by contractions */
                count=header.contractionIndex-header.expansion;
            } else {
                /* no contractions: expansions bounded by the main trie */
                count=header.mappingPosition-header.expansion;
            }
            ds->swapArray32(ds, inBytes+header.expansion, (int32_t)count,
                               outBytes+header.expansion, pErrorCode);
        }

        /* swap the contractions */
        if(header.contractionSize!=0) {
            /* contractionIndex: UChar[] */
            ds->swapArray16(ds, inBytes+header.contractionIndex, header.contractionSize*2,
                               outBytes+header.contractionIndex, pErrorCode);

            /* contractionCEs: CEs[] */
            ds->swapArray32(ds, inBytes+header.contractionCEs, header.contractionSize*4,
                               outBytes+header.contractionCEs, pErrorCode);
        }

        /* swap the main trie */
        if(header.mappingPosition!=0) {
            count=header.endExpansionCE-header.mappingPosition;
            utrie_swap(ds, inBytes+header.mappingPosition, (int32_t)count,
                          outBytes+header.mappingPosition, pErrorCode);
        }

        /* swap the max expansion table */
        if(header.endExpansionCECount!=0) {
            ds->swapArray32(ds, inBytes+header.endExpansionCE, header.endExpansionCECount*4,
                               outBytes+header.endExpansionCE, pErrorCode);
        }

        /* expansionCESize, unsafeCP, contrEndCP: uint8_t[], no need to swap */

        /* swap UCA constants */
        if(header.UCAConsts!=0) {
            /*
             * if UCAConsts!=0 then contractionUCACombos because we are swapping
             * the UCA data file, and we know that the UCA contains contractions
             */
            ds->swapArray32(ds, inBytes+header.UCAConsts, header.contractionUCACombos-header.UCAConsts,
                               outBytes+header.UCAConsts, pErrorCode);
        }

        /* swap UCA contractions */
        if(header.contractionUCACombosSize!=0) {
            count=header.contractionUCACombosSize*inHeader->contractionUCACombosWidth*U_SIZEOF_UCHAR;
            ds->swapArray16(ds, inBytes+header.contractionUCACombos, (int32_t)count,
                               outBytes+header.contractionUCACombos, pErrorCode);
        }
        
        /* swap the script to lead bytes */
        if(header.scriptToLeadByte!=0) {
            int indexCount = ds->readUInt16(*((uint16_t*)(inBytes+header.scriptToLeadByte))); // each entry = 2 * uint16
            int dataCount = ds->readUInt16(*((uint16_t*)(inBytes+header.scriptToLeadByte + 2))); // each entry = uint16
            ds->swapArray16(ds, inBytes+header.scriptToLeadByte, 
                                4 + (4 * indexCount) + (2 * dataCount),
                                outBytes+header.scriptToLeadByte, pErrorCode);
        }
        
        /* swap the lead byte to scripts */
        if(header.leadByteToScript!=0) {
            int indexCount = ds->readUInt16(*((uint16_t*)(inBytes+header.leadByteToScript))); // each entry = uint16
            int dataCount = ds->readUInt16(*((uint16_t*)(inBytes+header.leadByteToScript + 2))); // each entry = uint16
            ds->swapArray16(ds, inBytes+header.leadByteToScript, 
                                4 + (2 * indexCount) + (2 * dataCount),
                                outBytes+header.leadByteToScript, pErrorCode);
        }
    }

    return header.size;
}